

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeCall(Ref target)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)CALL);
  pVVar2 = cashew::Value::push_back(RVar1.inst,r);
  pVVar2 = cashew::Value::push_back(pVVar2,target);
  RVar1 = makeRawArray(0);
  RVar1.inst = cashew::Value::push_back(pVVar2,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeCall(Ref target) {
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(target)
              .push_back(makeRawArray());
  }